

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackIFWCommon *this_00;
  string *psVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer repositoryName;
  allocator local_21a;
  allocator local_219;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string FrameworkVersionOpt;
  string RepoGenOpt;
  string BinCreatorOpt;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string
            ((string *)&BinCreatorOpt,"CPACK_IFW_BINARYCREATOR_EXECUTABLE",
             (allocator *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&RepoGenOpt,"CPACK_IFW_REPOGEN_EXECUTABLE",(allocator *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&FrameworkVersionOpt,"CPACK_IFW_FRAMEWORK_VERSION",
             (allocator *)&cmCPackLog_msg);
  bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&BinCreatorOpt);
  if (((!bVar3) ||
      (bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&RepoGenOpt), !bVar3)) ||
     (bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&FrameworkVersionOpt), !bVar3))
  {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  this_00 = &this->super_cmCPackIFWCommon;
  pcVar5 = cmCPackIFWCommon::GetOption(this_00,&BinCreatorOpt);
  if (pcVar5 != (char *)0x0) {
    cmSystemTools::IsNOTFOUND((char *)0x2d3a8e);
  }
  std::__cxx11::string::assign((char *)&this->BinCreator);
  if ((this->BinCreator)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar2 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0xec,(char *)RepoAllVector.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
LAB_002d3eb7:
      std::__cxx11::string::~string((string *)&RepoAllVector);
    }
  }
  else {
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&RepoGenOpt);
    if (pcVar5 != (char *)0x0) {
      cmSystemTools::IsNOTFOUND((char *)0x2d3ade);
    }
    std::__cxx11::string::assign((char *)&this->RepoGen);
    cmCPackIFWCommon::GetOption(this_00,&FrameworkVersionOpt);
    std::__cxx11::string::assign((char *)&this->FrameworkVersion);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES",
               (allocator *)&RepoAllVector);
    bVar3 = cmCPackIFWCommon::IsOn(this_00,(string *)&cmCPackLog_msg);
    this->ResolveDuplicateNames = bVar3;
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->PkgsDirsVector);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGES_DIRECTORIES",
               (allocator *)&RepoAllVector);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar5,(allocator *)&RepoAllVector);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&this->PkgsDirsVector,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    (this->Installer).super_cmCPackIFWCommon.Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    (this->Repository).super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::assign((char *)&(this->Repository).Name);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_DOWNLOAD_SITE",(allocator *)&RepoAllVector);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&(this->Repository).Url);
      _cmCPackLog_msg = (pointer)&this->Repository;
      std::vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>>::
      emplace_back<cmCPackIFWRepository*>
                ((vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *)
                 &(this->Installer).RemoteRepositories,(cmCPackIFWRepository **)&cmCPackLog_msg);
    }
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_REPOSITORIES_ALL",(allocator *)&RepoAllVector);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 != (char *)0x0) {
      RepoAllVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      RepoAllVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      RepoAllVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar5,&local_21a);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&RepoAllVector,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      for (repositoryName =
                RepoAllVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          repositoryName !=
          RepoAllVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; repositoryName = repositoryName + 1) {
        GetRepository(this,repositoryName);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&RepoAllVector);
    }
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_DOWNLOAD_ALL",(allocator *)&RepoAllVector);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_DOWNLOAD_ALL",(allocator *)&RepoAllVector);
      pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (pcVar5 != (char *)0x0) {
        bVar3 = cmSystemTools::IsOn(pcVar5);
        goto LAB_002d3e29;
      }
      this->OnlineOnly = false;
    }
    else {
      bVar3 = cmSystemTools::IsOn(pcVar5);
LAB_002d3e29:
      this->OnlineOnly = bVar3;
    }
    if (((this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_start ==
         (this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_finish) || ((this->RepoGen)._M_string_length != 0)) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CMAKE_EXECUTABLE_SUFFIX",(allocator *)&RepoAllVector);
      pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      psVar1 = &this->ExecutableSuffix;
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::string::assign((char *)psVar1);
      }
      else {
        std::__cxx11::string::assign((char *)psVar1);
        if ((this->ExecutableSuffix)._M_string_length == 0) {
          std::__cxx11::string::string((string *)&RepoAllVector,"CMAKE_SYSTEM_NAME",&local_21a);
          pcVar5 = cmCPackIFWCommon::GetOption(this_00,(string *)&RepoAllVector);
          std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar5,&local_219);
          std::__cxx11::string::~string((string *)&RepoAllVector);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cmCPackLog_msg,"Linux");
          if (bVar3) {
            std::__cxx11::string::assign((char *)psVar1);
          }
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
      }
      iVar4 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      goto LAB_002d3fc8;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar2 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x12f,(char *)RepoAllVector.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_002d3eb7;
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar4 = 0;
LAB_002d3fc8:
  std::__cxx11::string::~string((string *)&FrameworkVersionOpt);
  std::__cxx11::string::~string((string *)&RepoGenOpt);
  std::__cxx11::string::~string((string *)&BinCreatorOpt);
  return iVar4;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";
  const std::string FrameworkVersionOpt = "CPACK_IFW_FRAMEWORK_VERSION";

  if (!this->IsSet(BinCreatorOpt) || !this->IsSet(RepoGenOpt) ||
      !this->IsSet(FrameworkVersionOpt)) {
    this->ReadListFile("CPackIFW.cmake");
  }

  // Look 'binarycreator' executable (needs)

  const char* BinCreatorStr = this->GetOption(BinCreatorOpt);
  if (!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr)) {
    this->BinCreator = "";
  } else {
    this->BinCreator = BinCreatorStr;
  }

  if (this->BinCreator.empty()) {
    cmCPackIFWLogger(ERROR, "Cannot find QtIFW compiler \"binarycreator\": "
                            "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Look 'repogen' executable (optional)

  const char* RepoGenStr = this->GetOption(RepoGenOpt);
  if (!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr)) {
    this->RepoGen = "";
  } else {
    this->RepoGen = RepoGenStr;
  }

  // Framework version
  if (const char* FrameworkVersionSrt = this->GetOption(FrameworkVersionOpt)) {
    this->FrameworkVersion = FrameworkVersionSrt;
  } else {
    this->FrameworkVersion = "1.9.9";
  }

  // Variables that Change Behavior

  // Resolve duplicate names
  this->ResolveDuplicateNames =
    this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  this->PkgsDirsVector.clear();
  if (const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->PkgsDirsVector);
  }

  // Installer
  this->Installer.Generator = this;
  this->Installer.ConfigureFromOptions();

  // Repository
  this->Repository.Generator = this;
  this->Repository.Name = "Unspecified";
  if (const char* site = this->GetOption("CPACK_DOWNLOAD_SITE")) {
    this->Repository.Url = site;
    this->Installer.RemoteRepositories.push_back(&this->Repository);
  }

  // Repositories
  if (const char* RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL")) {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr, RepoAllVector);
    for (std::vector<std::string>::iterator rit = RepoAllVector.begin();
         rit != RepoAllVector.end(); ++rit) {
      this->GetRepository(*rit);
    }
  }

  if (const char* ifwDownloadAll = this->GetOption("CPACK_IFW_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
  } else if (const char* cpackDownloadAll =
               this->GetOption("CPACK_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
  } else {
    this->OnlineOnly = false;
  }

  if (!this->Installer.RemoteRepositories.empty() && this->RepoGen.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW repository generator \"repogen\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Executable suffix
  if (const char* optExeSuffix = this->GetOption("CMAKE_EXECUTABLE_SUFFIX")) {
    this->ExecutableSuffix = optExeSuffix;
    if (this->ExecutableSuffix.empty()) {
      std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
      if (sysName == "Linux") {
        this->ExecutableSuffix = ".run";
      }
    }
  } else {
    this->ExecutableSuffix = this->cmCPackGenerator::GetOutputExtension();
  }

  return this->Superclass::InitializeInternal();
}